

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_get_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  curl_off_t cVar1;
  CURLcode CVar2;
  ftp_conn *ftpc;
  long lStack_58;
  _Bool connected;
  long in;
  char *buf;
  char *bytes;
  curl_off_t size;
  connectdata *conn;
  FTP *ftp;
  ftpstate local_1d;
  CURLcode result;
  ftpstate instate_local;
  Curl_easy *pCStack_18;
  int ftpcode_local;
  Curl_easy *data_local;
  
  ftp._4_4_ = CURLE_OK;
  conn = (connectdata *)(data->req).p.ftp;
  size = (curl_off_t)data->conn;
  local_1d = instate;
  result = ftpcode;
  pCStack_18 = data;
  if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
    bytes = (char *)0xffffffffffffffff;
    if ((instate == '\x1f') ||
       ((((*(uint *)&(data->state).field_0x774 >> 0xc & 1) != 0 ||
         ((*(ulong *)&(data->set).field_0x8ca >> 0x21 & 1) != 0)) ||
        (0 < (long)(conn->cpool_node)._next)))) {
      if (-1 < (long)(conn->cpool_node)._next) {
        bytes = (char *)(conn->cpool_node)._next;
      }
    }
    else {
      in = (long)Curl_dyn_ptr(&(((connectdata *)size)->proto).ftpc.pp.recvbuf);
      buf = strstr((char *)in," bytes");
      if (buf != (char *)0x0) {
        buf = buf + -1;
        lStack_58 = (long)buf - in;
        while( true ) {
          lStack_58 = lStack_58 + -1;
          if ((lStack_58 == 0) || (*buf == '(')) goto LAB_0013cac4;
          if ((*buf < '0') || ('9' < *buf)) break;
          buf = buf + -1;
        }
        buf = (char *)0x0;
LAB_0013cac4:
        if (buf != (char *)0x0) {
          buf = buf + 1;
          curlx_strtoofft(buf,(char **)0x0,10,(curl_off_t *)&bytes);
        }
      }
    }
    if (((pCStack_18->req).maxdownload < (long)bytes) && (0 < (pCStack_18->req).maxdownload)) {
      bytes = (char *)(pCStack_18->req).maxdownload;
      (pCStack_18->req).size = (curl_off_t)bytes;
    }
    else if ((local_1d != '\x1f') && ((*(uint *)&(pCStack_18->state).field_0x774 >> 0xc & 1) != 0))
    {
      bytes = (char *)0xffffffffffffffff;
    }
    if (((pCStack_18 != (Curl_easy *)0x0) &&
        ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
        (0 < ((pCStack_18->state).feat)->log_level)))) {
      Curl_infof(pCStack_18,"Maxdownload = %ld",(pCStack_18->req).maxdownload);
    }
    if ((((local_1d != '\x1f') && (pCStack_18 != (Curl_easy *)0x0)) &&
        ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
        (0 < ((pCStack_18->state).feat)->log_level)))) {
      Curl_infof(pCStack_18,"Getting file with size: %ld",bytes);
    }
    *(ftpstate *)(size + 0x54f) = local_1d;
    *(char **)(size + 0x520) = bytes;
    if ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0xc & 1) == 0) {
      CVar2 = InitiateTransfer(pCStack_18);
      return CVar2;
    }
    ftp._4_4_ = AllowServerConnect(pCStack_18,(_Bool *)((long)&ftpc + 7));
    cVar1 = size;
    if (ftp._4_4_ != CURLE_OK) {
      return ftp._4_4_;
    }
    if ((ftpc._7_1_ & 1) == 0) {
      if (((pCStack_18 != (Curl_easy *)0x0) &&
          ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
          (0 < ((pCStack_18->state).feat)->log_level)))) {
        Curl_infof(pCStack_18,"Data conn was not available immediately");
      }
      _ftp_state(pCStack_18,'\0');
      *(byte *)(cVar1 + 0x552) = *(byte *)(cVar1 + 0x552) & 0xdf | 0x20;
    }
  }
  else {
    if ((instate != '\x1f') || (ftpcode != 0x1c2)) {
      Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
      if (local_1d != ' ' || result != 0x226) {
        return CURLE_FTP_COULDNT_RETR_FILE;
      }
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    *(curl_pp_transfer *)&(conn->cpool_node)._prev = PPTRANSFER_NONE;
    _ftp_state(data,'\0');
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_get_resp(struct Curl_easy *data,
                                   int ftpcode,
                                   ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size = -1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->state.prefer_ascii &&
       !data->set.ignorecl &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either do not show the size or very
       * often uses size 0 anyway. ASCII transfers may very well turn out
       * that the transferred amount of data is not the same as this line
       * tells, why using this number in those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      char *bytes;
      char *buf = Curl_dyn_ptr(&conn->proto.ftpc.pp.recvbuf);
      bytes = strstr(buf, " bytes");
      if(bytes) {
        long in = (long)(--bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes = NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes) {
          ++bytes;
          /* get the number! */
          (void)curlx_strtoofft(bytes, NULL, 10, &size);
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->state.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" FMT_OFF_T, data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" FMT_OFF_T, size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      bool connected;

      result = AllowServerConnect(data, &connected);
      if(result)
        return result;

      if(!connected) {
        struct ftp_conn *ftpc = &conn->proto.ftpc;
        infof(data, "Data conn was not available immediately");
        ftp_state(data, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
      }
    }
    else
      return InitiateTransfer(data);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = PPTRANSFER_NONE; /* do not download anything */
      ftp_state(data, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550 ?
        CURLE_REMOTE_FILE_NOT_FOUND :
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}